

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzBitUi32s_Alloc(CSzBitUi32s *p,size_t num,ISzAlloc *alloc)

{
  long lVar1;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  
  if (in_RSI == 0) {
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  else {
    lVar1 = (*(code *)*in_RDX)(in_RDX,in_RSI + 7U >> 3);
    *in_RDI = lVar1;
    if (lVar1 == 0) {
      return 2;
    }
    lVar1 = (*(code *)*in_RDX)(in_RDX,in_RSI << 2);
    in_RDI[1] = lVar1;
    if (lVar1 == 0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes SzBitUi32s_Alloc(CSzBitUi32s *p, size_t num, ISzAlloc *alloc)
{
  if (num == 0)
  {
    p->Defs = NULL;
    p->Vals = NULL;
  }
  else
  {
    MY_ALLOC(Byte, p->Defs, (num + 7) >> 3, alloc);
    MY_ALLOC(UInt32, p->Vals, num, alloc);
  }
  return SZ_OK;
}